

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_d7a261::HandleFindCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *name;
  pointer pbVar1;
  pointer pcVar2;
  cmMakefile *this;
  bool bVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  ulong __val;
  ulong uVar7;
  char cVar8;
  bool bVar9;
  string_view value;
  string_view value_00;
  long *local_50;
  uint local_48;
  undefined4 uStack_44;
  long local_40 [2];
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if ((lVar6 >> 5) - 6U < 0xfffffffffffffffe) {
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"sub-command FIND requires 3 or 4 parameters.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    if (lVar6 == 0xa0) {
      iVar5 = std::__cxx11::string::compare((char *)(pbVar1 + 4));
      bVar9 = iVar5 == 0;
    }
    else {
      bVar9 = false;
    }
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (((long)(args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 != 0xa0) ||
       (iVar5 = std::__cxx11::string::compare((char *)(pbVar1 + 4)), iVar5 == 0)) {
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      name = pbVar1 + 3;
      iVar5 = std::__cxx11::string::compare((char *)name);
      bVar3 = iVar5 != 0;
      if (iVar5 == 0) {
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,
                   "sub-command FIND does not allow one to select REVERSE as the output variable.  Maybe you missed the actual output variable?"
                   ,"");
        std::__cxx11::string::_M_assign((string *)&status->Error);
        if (local_50 == local_40) {
          return bVar3;
        }
      }
      else {
        pcVar2 = pbVar1[2]._M_dataplus._M_p;
        if (bVar9) {
          __val = std::__cxx11::string::rfind((char *)(pbVar1 + 1),(ulong)pcVar2,0xffffffffffffffff)
          ;
        }
        else {
          __val = std::__cxx11::string::find((char *)(pbVar1 + 1),(ulong)pcVar2,0);
        }
        this = status->Makefile;
        if (__val == 0xffffffffffffffff) {
          value._M_str = "-1";
          value._M_len = 2;
          cmMakefile::AddDefinition(this,name,value);
          return bVar3;
        }
        cVar8 = '\x01';
        if (9 < __val) {
          uVar7 = __val;
          cVar4 = '\x04';
          do {
            cVar8 = cVar4;
            if (uVar7 < 100) {
              cVar8 = cVar8 + -2;
              goto LAB_002dab80;
            }
            if (uVar7 < 1000) {
              cVar8 = cVar8 + -1;
              goto LAB_002dab80;
            }
            if (uVar7 < 10000) goto LAB_002dab80;
            bVar9 = 99999 < uVar7;
            uVar7 = uVar7 / 10000;
            cVar4 = cVar8 + '\x04';
          } while (bVar9);
          cVar8 = cVar8 + '\x01';
        }
LAB_002dab80:
        local_50 = local_40;
        std::__cxx11::string::_M_construct((ulong)&local_50,cVar8);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_50,local_48,__val);
        value_00._M_len._4_4_ = uStack_44;
        value_00._M_len._0_4_ = local_48;
        value_00._M_str = (char *)local_50;
        cmMakefile::AddDefinition(this,name,value_00);
        if (local_50 == local_40) {
          return bVar3;
        }
      }
      operator_delete(local_50,local_40[0] + 1);
      return bVar3;
    }
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"sub-command FIND: unknown last parameter","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return false;
}

Assistant:

bool HandleFindCommand(std::vector<std::string> const& args,
                       cmExecutionStatus& status)
{
  if (args.size() != 4) {
    status.SetError("sub-command FIND requires three arguments.");
    return false;
  }

  const std::string& listName = args[1];
  const std::string& variableName = args.back();
  // expand the variable
  std::vector<std::string> varArgsExpanded;
  if (!GetList(varArgsExpanded, listName, status.GetMakefile())) {
    status.GetMakefile().AddDefinition(variableName, "-1");
    return true;
  }

  auto it = std::find(varArgsExpanded.begin(), varArgsExpanded.end(), args[2]);
  if (it != varArgsExpanded.end()) {
    status.GetMakefile().AddDefinition(
      variableName,
      std::to_string(std::distance(varArgsExpanded.begin(), it)));
    return true;
  }

  status.GetMakefile().AddDefinition(variableName, "-1");
  return true;
}